

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::cpp::anon_unknown_0::IntTypeName
                   (string *__return_storage_ptr__,Options *options,string *type)

{
  string *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,options,
             (long)&(type->_M_dataplus)._M_p + (long)&(options->dllexport_decl)._M_dataplus);
  psVar1 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar1;
}

Assistant:

std::string IntTypeName(const Options& options, const std::string& type) {
  return type + "_t";
}